

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O2

int ForcingStepReInit(void *arkode_mem,SUNStepper stepper1,SUNStepper stepper2,sunrealtype t0,
                     N_Vector y0)

{
  ARKodeMem ark_mem_00;
  int iVar1;
  int error_code;
  ARKodeForcingStepMem step_mem;
  ARKodeMem ark_mem;
  
  ark_mem = (ARKodeMem)0x0;
  step_mem = (ARKodeForcingStepMem)0x0;
  iVar1 = forcingStep_AccessARKODEStepMem(arkode_mem,"ForcingStepReInit",&ark_mem,&step_mem);
  ark_mem_00 = ark_mem;
  if (iVar1 == 0) {
    if (ark_mem->MallocDone == 0) {
      iVar1 = -0x17;
      arkProcessError(ark_mem,-0x17,0x20a,"ForcingStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                      ,"Attempt to call before ARKodeInit.");
    }
    else {
      iVar1 = forcingStep_CheckArgs(ark_mem,stepper1,stepper2,y0);
      if (iVar1 == 0) {
        step_mem->stepper[0] = stepper1;
        step_mem->stepper[1] = stepper2;
        step_mem->n_stepper_evolves[0] = 0;
        step_mem->n_stepper_evolves[1] = 0;
        error_code = arkInit(ark_mem_00,t0,y0,0);
        iVar1 = 0;
        if (error_code != 0) {
          arkProcessError(ark_mem_00,error_code,0x218,"ForcingStepReInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                          ,"Unable to initialize main ARKODE infrastructure");
          iVar1 = error_code;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int ForcingStepReInit(void* arkode_mem, SUNStepper stepper1,
                      SUNStepper stepper2, sunrealtype t0, N_Vector y0)
{
  ARKodeMem ark_mem             = NULL;
  ARKodeForcingStepMem step_mem = NULL;

  int retval = forcingStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                               &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return ARK_NO_MALLOC;
  }

  retval = forcingStep_CheckArgs(ark_mem, stepper1, stepper2, y0);
  if (retval != ARK_SUCCESS) { return retval; }

  forcingStep_InitStepMem(step_mem, stepper1, stepper2);

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    return retval;
  }

  return ARK_SUCCESS;
}